

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::reallocData(QString *this,qsizetype alloc,AllocationOption option)

{
  bool bVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  undefined4 in_EDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  bool cannotUseReallocate;
  DataPointer dd;
  undefined8 in_stack_ffffffffffffff98;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  QArrayDataPointer<char16_t> *alloc_00;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QArrayDataPointer<char16_t> *)0x0) {
    QArrayDataPointer<char16_t>::fromRawData
              ((char16_t *)in_RDI,(qsizetype)in_stack_ffffffffffffffa0);
    QArrayDataPointer<char16_t>::operator=(in_RDI,in_stack_ffffffffffffffa0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  else {
    alloc_00 = in_RDI;
    local_10 = in_RSI;
    qVar2 = QArrayDataPointer<char16_t>::freeSpaceAtBegin(in_RDI);
    uVar4 = CONCAT13(0 < qVar2,(int3)in_stack_ffffffffffffffb0);
    QArrayDataPointer<char16_t>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<char16_t>::needsDetach(in_stack_ffffffffffffffa0);
    if ((bVar1) || ((uVar4 & 0x1000000) != 0)) {
      this_00 = (QArrayDataPointer<char16_t> *)&DAT_aaaaaaaaaaaaaaaa;
      qMin<long_long>((longlong *)&local_10,&in_RDI->size);
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (this_00,(qsizetype)alloc_00,CONCAT44(in_EDX,uVar4),
                 (AllocationOption)((ulong)in_RDI >> 0x20));
      qt_noop();
      pcVar3 = QArrayDataPointer<char16_t>::data
                         ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffc0);
      pcVar3[0x2aaaaaaaaaaaaaaa] = L'\0';
      QArrayDataPointer<char16_t>::operator=(in_RDI,local_10);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_10);
    }
    else {
      QArrayDataPointer<char16_t>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<char16_t>::reallocate
                ((QPodArrayOps<char16_t> *)in_RDI,(qsizetype)in_stack_ffffffffffffffa0,
                 (AllocationOption)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QString::reallocData(qsizetype alloc, QArrayData::AllocationOption option)
{
    if (!alloc) {
        d = DataPointer::fromRawData(&_empty, 0);
        return;
    }

    // don't use reallocate path when reducing capacity and there's free space
    // at the beginning: might shift data pointer outside of allocated space
    const bool cannotUseReallocate = d.freeSpaceAtBegin() > 0;

    if (d->needsDetach() || cannotUseReallocate) {
        DataPointer dd(alloc, qMin(alloc, d.size), option);
        Q_CHECK_PTR(dd.data());
        if (dd.size > 0)
            ::memcpy(dd.data(), d.data(), dd.size * sizeof(QChar));
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(alloc, option);
    }
}